

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_tpl_varnames_h.cc
# Opt level: O3

string * WrapWithGuard(string *__return_storage_ptr__,string *output_file,string *header_entries)

{
  undefined1 uVar1;
  int iVar2;
  long *plVar3;
  string *extraout_RAX;
  string *psVar4;
  long *plVar5;
  int __c;
  ulong uVar6;
  string guard;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [16];
  
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"TPL_","");
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(output_file->_M_dataplus)._M_p);
  local_70 = (string *)local_60;
  psVar4 = (string *)(plVar3 + 2);
  if ((string *)*plVar3 == psVar4) {
    local_60._0_8_ = (psVar4->_M_dataplus)._M_p;
    local_60._8_8_ = plVar3[3];
  }
  else {
    local_60._0_8_ = (psVar4->_M_dataplus)._M_p;
    local_70 = (string *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_68 != 0) {
    uVar6 = 0;
    do {
      psVar4 = local_70;
      __c = (int)*(char *)((long)&(local_70->_M_dataplus)._M_p + uVar6);
      iVar2 = isalnum(__c);
      if (iVar2 == 0) {
        uVar1 = 0x5f;
      }
      else {
        iVar2 = toupper(__c);
        uVar1 = (undefined1)iVar2;
      }
      *(undefined1 *)((long)&(psVar4->_M_dataplus)._M_p + uVar6) = uVar1;
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_68);
  }
  std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_50._M_allocated_capacity = (size_type)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_60 + 0x10),"#ifndef ","");
  plVar3 = (long *)std::__cxx11::string::_M_append(local_60 + 0x10,(ulong)local_70);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar5;
    local_b0 = (long *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((undefined1 *)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity);
  }
  local_50._M_allocated_capacity = (size_type)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_60 + 0x10),"#define ","");
  plVar3 = (long *)std::__cxx11::string::_M_append(local_60 + 0x10,(ulong)local_70);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar5;
    local_b0 = (long *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((undefined1 *)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity);
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(header_entries->_M_dataplus)._M_p);
  local_50._M_allocated_capacity = (size_type)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_60 + 0x10),"\n#endif  // ","");
  plVar3 = (long *)std::__cxx11::string::_M_append(local_60 + 0x10,(ulong)local_70);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar5;
    local_b0 = (long *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((undefined1 *)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity);
  }
  psVar4 = (string *)local_60;
  if (local_70 != psVar4) {
    operator_delete(local_70);
    psVar4 = extraout_RAX;
  }
  return psVar4;
}

Assistant:

static string WrapWithGuard(const string& output_file,
                            const string& header_entries) {
  string guard(string("TPL_") + output_file);
  ConvertToIdentifier(&guard);
  guard.append("_H_");

  string out;
  out.append(string("#ifndef ") + guard + "\n");
  out.append(string("#define ") + guard + "\n\n");

  // Now append the header-entry info to the intro above
  out.append(header_entries);

  out.append(string("\n#endif  // ") + guard + "\n");
  return out;
}